

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_004375c0 == '\x01') {
    DAT_004375c0 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_00437638 == '\x01') {
    DAT_00437638 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_004376b0 == '\x01') {
    DAT_004376b0 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_00437728 == '\x01') {
    DAT_00437728 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_00437760 == '\x01') {
    DAT_00437760 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_00437790 == '\x01') {
    DAT_00437790 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_004377c0 == '\x01') {
    DAT_004377c0 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_004377f0 == '\x01') {
    DAT_004377f0 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_00437820 == '\x01') {
    DAT_00437820 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_00437850 == '\x01') {
    DAT_00437850 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_00437880 == '\x01') {
    DAT_00437880 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}